

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoardView.cpp
# Opt level: O0

void __thiscall BoardView::CenterZoomNet(BoardView *this,string *netname)

{
  bool bVar1;
  __type _Var2;
  element_type *peVar3;
  element_type *peVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  float x;
  float y;
  float sy;
  float sx;
  float dy;
  float dx;
  Point p;
  shared_ptr<Pin> *pin;
  iterator __end1;
  iterator __begin1;
  SharedVector<Pin> *__range1;
  int i;
  ImVec2 max;
  ImVec2 min;
  ImVec2 view;
  vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_> *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  float fVar5;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  BoardView *in_stack_ffffffffffffff80;
  float local_58;
  float fStack_54;
  __normal_iterator<std::shared_ptr<Pin>_*,_std::vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>_>
  local_40;
  undefined8 local_38;
  uint local_2c;
  ImVec2 local_28;
  ImVec2 local_20;
  undefined8 local_18;
  
  local_18 = in_RDI[0x6af].field_2._M_allocated_capacity;
  ImVec2::ImVec2(&local_20);
  ImVec2::ImVec2(&local_28);
  local_2c = 0;
  if ((in_RDI[0x657]._M_string_length & 0x10000000000) != 0) {
    local_20.y = 3.4028235e+38;
    local_20.x = 3.4028235e+38;
    local_28.y = 1.1754944e-38;
    local_28.x = 1.1754944e-38;
    local_38 = (**(code **)(*(long *)in_RDI->_M_string_length + 0x20))();
    local_40._M_current =
         (shared_ptr<Pin> *)
         std::vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>::begin
                   (in_stack_ffffffffffffff68);
    std::vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>::end
              (in_stack_ffffffffffffff68);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<std::shared_ptr<Pin>_*,_std::vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>_>
                               *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                              (__normal_iterator<std::shared_ptr<Pin>_*,_std::vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>_>
                               *)in_stack_ffffffffffffff68), bVar1) {
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<Pin>_*,_std::vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>_>
      ::operator*(&local_40);
      std::__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x1214d2);
      _Var2 = std::operator==(in_RDI,in_RSI);
      if (_Var2) {
        peVar3 = std::__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                           ((__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                            0x1214f7);
        local_58 = (peVar3->position).x;
        if (local_58 < local_20.x) {
          local_20.x = local_58;
        }
        fStack_54 = (peVar3->position).y;
        if (fStack_54 < local_20.y) {
          local_20.y = fStack_54;
        }
        if (local_28.x < local_58) {
          local_28.x = local_58;
        }
        if (local_28.y < fStack_54) {
          local_28.y = fStack_54;
        }
        if (((in_RDI[0x657]._M_string_length & 0x1000000000000) != 0) &&
           (peVar3 = std::__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->((__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x121588), *(int *)&(peVar3->super_BoardElement).field_0xc != 4))
        {
          std::__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                    ((__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x12159c)
          ;
          bVar1 = contains<std::shared_ptr<Component>>
                            ((shared_ptr<Component> *)in_RDI,
                             (vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
                              *)in_RSI);
          if (!bVar1) {
            std::__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                      ((__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       0x1215c2);
            std::__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       0x1215ce);
            std::__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                      ((__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       0x1215d8);
            peVar4 = std::__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->((__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x1215e4);
            peVar4->visualmode = '\x01';
            in_stack_ffffffffffffff80 = (BoardView *)&in_RDI[0x694]._M_string_length;
            std::__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                      ((__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       0x121608);
            std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>::
            push_back((vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
                       *)in_stack_ffffffffffffff80,
                      (value_type *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
          }
        }
      }
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<Pin>_*,_std::vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>_>
      ::operator++(&local_40);
    }
    if (((((local_20.x != 3.4028235e+38) || (NAN(local_20.x))) &&
         ((local_20.y != 3.4028235e+38 || (NAN(local_20.y))))) &&
        ((local_28.x != 1.1754944e-38 || (NAN(local_28.x))))) &&
       ((local_28.y != 1.1754944e-38 || (NAN(local_28.y))))) {
      if ((in_RDI[0x68d].field_2._M_local_buf[8] & 1U) != 0) {
        fprintf(_stderr,"CenterzoomNet: bbox[%d]: %0.1f %0.1f - %0.1f %0.1f\n",(double)local_20.x,
                (double)local_20.y,(double)local_28.x,(double)local_28.y,(ulong)local_2c);
      }
      if (local_28.x - local_20.x <= 0.0) {
        x = 3.4028235e+38;
      }
      else {
        x = (float)local_18 / (local_28.x - local_20.x);
      }
      if (local_28.y - local_20.y <= 0.0) {
        y = 3.4028235e+38;
      }
      else {
        y = local_18._4_4_ / (local_28.y - local_20.y);
      }
      fVar5 = y;
      if (x < y) {
        fVar5 = x;
      }
      *(float *)&in_RDI[0x6ae]._M_string_length = fVar5;
      if ((*(float *)&in_RDI[0x6ae]._M_string_length == 3.4028235e+38) &&
         (!NAN(*(float *)&in_RDI[0x6ae]._M_string_length))) {
        *(undefined4 *)&in_RDI[0x6ae]._M_string_length =
             *(undefined4 *)((long)&in_RDI[0x6ae]._M_string_length + 4);
      }
      *(float *)&in_RDI[0x6ae]._M_string_length =
           *(float *)&in_RDI[0x6ae]._M_string_length / *(float *)&in_RDI[0x655].field_0x4;
      if (*(float *)&in_RDI[0x6ae]._M_string_length <
          *(float *)((long)&in_RDI[0x6ae]._M_string_length + 4)) {
        *(undefined4 *)&in_RDI[0x6ae]._M_string_length =
             *(undefined4 *)((long)&in_RDI[0x6ae]._M_string_length + 4);
      }
      *(float *)((long)&in_RDI[0x6ad].field_2 + 8) = (local_28.x - local_20.x) / 2.0 + local_20.x;
      *(float *)((long)&in_RDI[0x6ad].field_2 + 0xc) = (local_28.y - local_20.y) / 2.0 + local_20.y;
      SetTarget(in_stack_ffffffffffffff80,x,y);
      in_RDI[0x6b5].field_0x6 = 1;
    }
  }
  return;
}

Assistant:

void BoardView::CenterZoomNet(std::string netname) {
	ImVec2 view = m_board_surface;
	ImVec2 min, max;
	int i = 0;

	if (!config.infoPanelCenterZoomNets) return;

	min.x = min.y = FLT_MAX;
	max.x = max.y = FLT_MIN;

	for (auto &pin : m_board->Pins()) {
		if (pin->net->name == netname) {
			auto p = pin->position;
			if (p.x < min.x) min.x = p.x;
			if (p.y < min.y) min.y = p.y;
			if (p.x > max.x) max.x = p.x;
			if (p.y > max.y) max.y = p.y;

			if ((config.infoPanelSelectPartsOnNet) && (pin->type != Pin::kPinTypeTestPad)) {
				if (!contains(pin->component, m_partHighlighted)) {
					pin->component->visualmode = pin->component->CVMSelected;
					m_partHighlighted.push_back(pin->component);
				}
			}
		}
	}

	// Bounds check!
	if ((min.x == FLT_MAX) || (min.y == FLT_MAX) || (max.x == FLT_MIN) || (max.y == FLT_MIN)) return;

	if (debug) fprintf(stderr, "CenterzoomNet: bbox[%d]: %0.1f %0.1f - %0.1f %0.1f\n", i, min.x, min.y, max.x, max.y);

	float dx = (max.x - min.x);
	float dy = (max.y - min.y);
	float sx = dx > 0 ? view.x / dx : FLT_MAX;
	float sy = dy > 0 ? view.y / dy : FLT_MAX;

	m_scale = sx < sy ? sx : sy;
	if (m_scale == FLT_MAX) m_scale = m_scale_floor;
	m_scale /= config.partZoomScaleOutFactor;
	if (m_scale < m_scale_floor) m_scale = m_scale_floor;

	/*
	float dx = (max.x - min.x);
	float dy = (max.y - min.y);
	float sx = dx > 0 ? view.x / dx : 1.0f;
	float sy = dy > 0 ? view.y / dy : 1.0f;

	//  m_rotation = 0;
	m_scale = sx < sy ? sx : sy;
	m_scale /= config.partZoomScaleOutFactor;
	if (m_scale < m_scale_floor) m_scale = m_scale_floor;
	*/

	m_dx = (max.x - min.x) / 2 + min.x;
	m_dy = (max.y - min.y) / 2 + min.y;
	SetTarget(m_dx, m_dy);
	m_needsRedraw = true;
}